

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

void Url_Decode_UTF8(string *source)

{
  char *pcVar1;
  pointer pcVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  char *__s;
  char local_418 [8];
  char tp [1000];
  
  __s = local_418;
  pcVar6 = (char *)0x0;
  memset(__s,0,1000);
  pcVar1 = (char *)source->_M_string_length;
  if (pcVar1 != (char *)0x0) {
    pcVar2 = (source->_M_dataplus)._M_p;
    do {
      cVar4 = pcVar6[(long)pcVar2];
      iVar5 = 1;
      if (cVar4 == '%') {
        cVar4 = '\t';
        if (pcVar6[(long)(pcVar2 + 1)] < 'A') {
          cVar4 = '\0';
        }
        cVar3 = -0x37;
        if (pcVar6[(long)(pcVar2 + 2)] < 'A') {
          cVar3 = -0x30;
        }
        cVar4 = cVar3 + pcVar6[(long)(pcVar2 + 2)] + (cVar4 + pcVar6[(long)(pcVar2 + 1)]) * '\x10';
        iVar5 = 3;
      }
      pcVar6 = (char *)(ulong)(uint)((int)pcVar6 + iVar5);
      *__s = cVar4;
      __s = __s + 1;
    } while (pcVar1 != pcVar6);
  }
  strlen(local_418);
  std::__cxx11::string::_M_replace((ulong)source,0,pcVar1,(ulong)local_418);
  return;
}

Assistant:

void Url_Decode_UTF8(std::string &source)
{
  char tp[1000];
  int i,pos=0;
  memset(tp,0,1000);
  const char * point=source.c_str();
  for (i=0;source.size()-i;)
  {
    if (point[i]=='%')
    {
      unsigned char k=trans2bit(point[i+1])*16+trans2bit(point[i+2]);
      tp[pos++]=k;
      i+=3;
    }
    else 
     tp[pos++]= point[i++];
  }
  source=tp;
  //printf("Url_Decode_UTF8 : %s\n",source.c_str());
}